

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_aws_sigv4.c
# Opt level: O0

CURLcode canon_query(Curl_easy *data,char *query,dynbuf *dq)

{
  char cVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  size_t sVar5;
  undefined1 local_48b;
  char cStack_48a;
  char local_489;
  char acStack_488 [5];
  char out [3];
  char hex [17];
  undefined2 local_46c;
  char local_46a;
  byte local_469;
  char tmp [3];
  byte *pbStack_468;
  _Bool found_equals;
  char *q;
  size_t len;
  char *amp;
  pair *ap;
  pair array [64];
  char *local_40;
  char *p;
  int local_30;
  int i;
  int entry;
  CURLcode result;
  dynbuf *dq_local;
  char *query_local;
  Curl_easy *data_local;
  
  i = 0;
  local_30 = 0;
  amp = (char *)&ap;
  local_40 = query;
  iVar2 = local_30;
  if (query == (char *)0x0) {
    data_local._4_4_ = CURLE_OK;
  }
  else {
    do {
      local_30 = iVar2;
      iVar2 = local_30 + 1;
      *(char **)amp = local_40;
      pcVar4 = strchr(local_40,0x26);
      if (pcVar4 == (char *)0x0) {
        sVar5 = strlen(local_40);
        *(size_t *)(amp + 8) = sVar5;
        break;
      }
      *(long *)(amp + 8) = (long)pcVar4 - (long)local_40;
      amp = amp + 0x10;
      local_40 = pcVar4 + 1;
    } while (iVar2 < 0x40);
    if (iVar2 == 0x40) {
      Curl_failf(data,"aws-sigv4: too many query pairs in URL");
      data_local._4_4_ = CURLE_URL_MALFORMAT;
    }
    else {
      qsort(&ap,(long)iVar2,0x10,compare_func);
      amp = (char *)&ap;
      for (p._4_4_ = 0; i == 0 && p._4_4_ < iVar2; p._4_4_ = p._4_4_ + 1) {
        pbStack_468 = *(byte **)amp;
        local_469 = 0;
        if (*(long *)(amp + 8) != 0) {
          for (q = *(char **)(amp + 8); q != (char *)0x0 && i == 0; q = q + -1) {
            if (((((char)*pbStack_468 < '0') || ('9' < (char)*pbStack_468)) &&
                (((char)*pbStack_468 < 'a' || ('z' < (char)*pbStack_468)))) &&
               (((char)*pbStack_468 < 'A' || ('Z' < (char)*pbStack_468)))) {
              iVar3 = (int)(char)*pbStack_468;
              if (iVar3 == 0x25) {
                if ((((((char)pbStack_468[1] < '0') || ('9' < (char)pbStack_468[1])) &&
                     (((char)pbStack_468[1] < 'a' || ('f' < (char)pbStack_468[1])))) &&
                    (((char)pbStack_468[1] < 'A' || ('F' < (char)pbStack_468[1])))) ||
                   ((((char)pbStack_468[2] < '0' || ('9' < (char)pbStack_468[2])) &&
                    ((((char)pbStack_468[2] < 'a' || ('f' < (char)pbStack_468[2])) &&
                     (((char)pbStack_468[2] < 'A' || ('F' < (char)pbStack_468[2])))))))) {
                  i = Curl_dyn_addn(dq,"%25",3);
                }
                else {
                  local_46c = 0x25;
                  local_46a = 0;
                  cVar1 = Curl_raw_toupper(pbStack_468[1]);
                  local_46c = CONCAT11(cVar1,(undefined1)local_46c);
                  local_46a = Curl_raw_toupper(pbStack_468[2]);
                  i = Curl_dyn_addn(dq,&local_46c,3);
                  pbStack_468 = pbStack_468 + 2;
                  q = q + -2;
                }
              }
              else if (iVar3 - 0x2dU < 2) {
LAB_00d15d4b:
                i = Curl_dyn_addn(dq,pbStack_468,1);
              }
              else if (iVar3 == 0x3d) {
                i = Curl_dyn_addn(dq,pbStack_468,1);
                local_469 = 1;
              }
              else {
                if ((iVar3 == 0x5f) || (iVar3 == 0x7e)) goto LAB_00d15d4b;
                builtin_strncpy(acStack_488,"01234",5);
                out[0] = '5';
                out[1] = '6';
                out[2] = '7';
                _local_48b = CONCAT11(acStack_488[(int)(uint)*pbStack_468 >> 4],0x25);
                local_489 = acStack_488[(int)((int)(char)*pbStack_468 & 0xf)];
                i = Curl_dyn_addn(dq,&local_48b,3);
              }
            }
            else {
              i = Curl_dyn_addn(dq,pbStack_468,1);
            }
            pbStack_468 = pbStack_468 + 1;
          }
          if ((i == 0) && ((local_469 & 1) == 0)) {
            i = Curl_dyn_addn(dq,"=",1);
          }
          if ((i == 0) && (p._4_4_ < local_30)) {
            i = Curl_dyn_addn(dq,"&",1);
          }
        }
        amp = amp + 0x10;
      }
      data_local._4_4_ = i;
    }
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode canon_query(struct Curl_easy *data,
                            const char *query, struct dynbuf *dq)
{
  CURLcode result = CURLE_OK;
  int entry = 0;
  int i;
  const char *p = query;
  struct pair array[MAX_QUERYPAIRS];
  struct pair *ap = &array[0];
  if(!query)
    return result;

  /* sort the name=value pairs first */
  do {
    char *amp;
    entry++;
    ap->p = p;
    amp = strchr(p, '&');
    if(amp)
      ap->len = amp - p; /* excluding the ampersand */
    else {
      ap->len = strlen(p);
      break;
    }
    ap++;
    p = amp + 1;
  } while(entry < MAX_QUERYPAIRS);
  if(entry == MAX_QUERYPAIRS) {
    /* too many query pairs for us */
    failf(data, "aws-sigv4: too many query pairs in URL");
    return CURLE_URL_MALFORMAT;
  }

  qsort(&array[0], entry, sizeof(struct pair), compare_func);

  ap = &array[0];
  for(i = 0; !result && (i < entry); i++, ap++) {
    size_t len;
    const char *q = ap->p;
    bool found_equals = false;
    if(!ap->len)
      continue;
    for(len = ap->len; len && !result; q++, len--) {
      if(ISALNUM(*q))
        result = Curl_dyn_addn(dq, q, 1);
      else {
        switch(*q) {
        case '-':
        case '.':
        case '_':
        case '~':
          /* allowed as-is */
          result = Curl_dyn_addn(dq, q, 1);
          break;
        case '=':
          /* allowed as-is */
          result = Curl_dyn_addn(dq, q, 1);
          found_equals = true;
          break;
        case '%':
          /* uppercase the following if hexadecimal */
          if(ISXDIGIT(q[1]) && ISXDIGIT(q[2])) {
            char tmp[3]="%";
            tmp[1] = Curl_raw_toupper(q[1]);
            tmp[2] = Curl_raw_toupper(q[2]);
            result = Curl_dyn_addn(dq, tmp, 3);
            q += 2;
            len -= 2;
          }
          else
            /* '%' without a following two-digit hex, encode it */
            result = Curl_dyn_addn(dq, "%25", 3);
          break;
        default: {
          /* URL encode */
          const char hex[] = "0123456789ABCDEF";
          char out[3]={'%'};
          out[1] = hex[((unsigned char)*q)>>4];
          out[2] = hex[*q & 0xf];
          result = Curl_dyn_addn(dq, out, 3);
          break;
        }
        }
      }
    }
    if(!result && !found_equals) {
      /* queries without value still need an equals */
      result = Curl_dyn_addn(dq, "=", 1);
    }
    if(!result && i < entry - 1) {
      /* insert ampersands between query pairs */
      result = Curl_dyn_addn(dq, "&", 1);
    }
  }
  return result;
}